

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<unsigned_int,4>>
          (LayeredImage *this,int x,int y,int z,Vector<unsigned_int,_4> *color)

{
  TextureFormat *pTVar1;
  long lVar2;
  PixelBufferAccess access;
  Vector<int,_4> res;
  ConstPixelBufferAccess local_60;
  IVec4 local_38;
  
  switch(*(undefined4 *)this) {
  case 0:
    pTVar1 = *(TextureFormat **)(*(long *)(this + 0x28) + 0x20);
    local_60.m_format = *pTVar1;
    lVar2 = 0;
    do {
      local_60.m_size.m_data[lVar2] = (&pTVar1[1].order)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar2 = 0;
    do {
      local_60.m_pitch.m_data[lVar2] = (&pTVar1[2].type)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    break;
  case 1:
    pTVar1 = *(TextureFormat **)
              (*(long *)(this + 0x38) + 0xa0 +
              (ulong)(uint)(&glslImageFuncZToCubeFace(int)::faces)[z] * 0x18);
    local_60.m_format = *pTVar1;
    lVar2 = 0;
    do {
      local_60.m_size.m_data[lVar2] = (&pTVar1[1].order)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar2 = 0;
    do {
      local_60.m_pitch.m_data[lVar2] = (&pTVar1[2].type)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    break;
  case 2:
    pTVar1 = *(TextureFormat **)(*(long *)(this + 0x58) + 0x20);
    local_60.m_format = *pTVar1;
    lVar2 = 0;
    do {
      local_60.m_size.m_data[lVar2] = (&pTVar1[1].order)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar2 = 0;
    do {
      local_60.m_pitch.m_data[lVar2] = (&pTVar1[2].type)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    break;
  case 3:
    pTVar1 = *(TextureFormat **)(*(long *)(this + 0x48) + 0x20);
    local_60.m_format = *pTVar1;
    lVar2 = 0;
    do {
      local_60.m_size.m_data[lVar2] = (&pTVar1[1].order)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar2 = 0;
    do {
      local_60.m_pitch.m_data[lVar2] = (&pTVar1[2].type)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    break;
  default:
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_60);
    goto LAB_004470ff;
  case 7:
    pTVar1 = *(TextureFormat **)(*(long *)(this + 0x18) + 0x20);
    local_60.m_format = *pTVar1;
    lVar2 = 0;
    do {
      local_60.m_size.m_data[lVar2] = (&pTVar1[1].order)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar2 = 0;
    do {
      local_60.m_pitch.m_data[lVar2] = (&pTVar1[2].type)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  local_60.m_data = *(void **)(pTVar1 + 4);
LAB_004470ff:
  if (*(int *)this == 1) {
    z = 0;
  }
  local_38.m_data._0_8_ = *(undefined8 *)color->m_data;
  local_38.m_data._8_8_ = *(undefined8 *)(color->m_data + 2);
  tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&local_60,&local_38,x,y,z);
  return;
}

Assistant:

void LayeredImage::setPixel (int x, int y, int z, const ColorT& color) const
{
	const PixelBufferAccess access = m_type == TEXTURETYPE_BUFFER		? m_texBuffer->getLevel(0)
								   : m_type == TEXTURETYPE_2D			? m_tex2D->getLevel(0)
								   : m_type == TEXTURETYPE_CUBE			? m_texCube->getLevelFace(0, glslImageFuncZToCubeFace(z))
								   : m_type == TEXTURETYPE_3D			? m_tex3D->getLevel(0)
								   : m_type == TEXTURETYPE_2D_ARRAY		? m_tex2DArray->getLevel(0)
								   : PixelBufferAccess();

	access.setPixel(color, x, y, m_type == TEXTURETYPE_CUBE ? 0 : z);
}